

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Cluster * __thiscall mkvparser::Segment::FindCluster(Segment *this,longlong time_ns)

{
  longlong lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Cluster *this_00;
  
  if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
    this_00 = &this->m_eos;
  }
  else {
    this_00 = *this->m_clusters;
    lVar1 = Cluster::GetTime(this_00);
    if (lVar1 < time_ns) {
      lVar5 = 0;
      lVar2 = this->m_clusterCount;
      if (0 < this->m_clusterCount) {
        do {
          lVar4 = (lVar2 - lVar5) / 2;
          lVar3 = lVar5 + lVar4;
          lVar1 = Cluster::GetTime(this->m_clusters[lVar3]);
          if (lVar1 <= time_ns) {
            lVar5 = lVar5 + lVar4 + 1;
            lVar3 = lVar2;
          }
          lVar2 = lVar3;
        } while (lVar5 < lVar3);
      }
      this_00 = this->m_clusters[lVar5 + -1];
    }
  }
  return this_00;
}

Assistant:

const Cluster* Segment::FindCluster(long long time_ns) const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  {
    Cluster* const pCluster = m_clusters[0];
    assert(pCluster);
    assert(pCluster->m_index == 0);

    if (time_ns <= pCluster->GetTime())
      return pCluster;
  }

  // Binary search of cluster array

  long i = 0;
  long j = m_clusterCount;

  while (i < j) {
    // INVARIANT:
    //[0, i) <= time_ns
    //[i, j) ?
    //[j, m_clusterCount)  > time_ns

    const long k = i + (j - i) / 2;
    assert(k < m_clusterCount);

    Cluster* const pCluster = m_clusters[k];
    assert(pCluster);
    assert(pCluster->m_index == k);

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    assert(i <= j);
  }

  assert(i == j);
  assert(i > 0);
  assert(i <= m_clusterCount);

  const long k = i - 1;

  Cluster* const pCluster = m_clusters[k];
  assert(pCluster);
  assert(pCluster->m_index == k);
  assert(pCluster->GetTime() <= time_ns);

  return pCluster;
}